

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void rtfi_handleDataFunc(void *inSparseImageBuffer,IceTInt src)

{
  IceTInt *pIVar1;
  IceTInt *process_orders;
  IceTSparseImage IStack_20;
  IceTInt rank;
  IceTSparseImage inSparseImage;
  IceTInt src_local;
  void *inSparseImageBuffer_local;
  
  inSparseImage.opaque_internals._4_4_ = src;
  if (inSparseImageBuffer == (void *)0x0) {
    if (rtfi_first == '\0') {
      icetRaiseDiagnostic("Unexpected callback order in icetRenderTransferFullImages.",0xffffffff,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/common.c"
                          ,0x36);
    }
  }
  else {
    IStack_20 = icetSparseImageUnpackageFromReceive(inSparseImageBuffer);
    if (rtfi_first == '\0') {
      icetGetIntegerv(2,(IceTInt *)((long)&process_orders + 4));
      pIVar1 = icetUnsafeStateGetInteger(0x2a);
      icetCompressedComposite
                (rtfi_image,IStack_20,
                 (uint)(pIVar1[inSparseImage.opaque_internals._4_4_] < pIVar1[process_orders._4_4_])
                );
    }
    else {
      icetDecompressImage(IStack_20,rtfi_image);
    }
  }
  rtfi_first = '\0';
  return;
}

Assistant:

static void rtfi_handleDataFunc(void *inSparseImageBuffer, IceTInt src) {
    if (inSparseImageBuffer == NULL) {
      /* Superfluous call from send to self. */
        if (!rtfi_first) {
            icetRaiseError("Unexpected callback order"
                           " in icetRenderTransferFullImages.",
                           ICET_SANITY_CHECK_FAIL);
        }
    } else {
        IceTSparseImage inSparseImage
            = icetSparseImageUnpackageFromReceive(inSparseImageBuffer);
        if (rtfi_first) {
            icetDecompressImage(inSparseImage, rtfi_image);
        } else {
            IceTInt rank;
            const IceTInt *process_orders;
            icetGetIntegerv(ICET_RANK, &rank);
            process_orders = icetUnsafeStateGetInteger(ICET_PROCESS_ORDERS);
            icetCompressedComposite(rtfi_image, inSparseImage,
                                    process_orders[src] < process_orders[rank]);
        }
    }
    rtfi_first = ICET_FALSE;
}